

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcShow.c
# Opt level: O0

void Wlc_NtkShow(Wlc_Ntk_t *p,Vec_Int_t *vBold)

{
  int iVar1;
  char *__ptr;
  char *local_100;
  char *pSpec;
  char *pName;
  char FileNameDot [200];
  FILE *pFile;
  Vec_Int_t *vBold_local;
  Wlc_Ntk_t *p_local;
  
  __ptr = Extra_FileDesignName(p->pName);
  if (p->pSpec == (char *)0x0) {
    local_100 = "unknown";
  }
  else {
    local_100 = Extra_FileDesignName(p->pSpec);
  }
  sprintf((char *)&pName,"%s_%s.dot",__ptr,local_100);
  if (__ptr != (char *)0x0) {
    free(__ptr);
  }
  iVar1 = strcmp(local_100,"unknown");
  if ((iVar1 != 0) && (local_100 != (char *)0x0)) {
    free(local_100);
  }
  FileNameDot._192_8_ = fopen((char *)&pName,"w");
  if ((FILE *)FileNameDot._192_8_ == (FILE *)0x0) {
    fprintf(_stdout,"Cannot open the intermediate file \"%s\".\n",&pName);
  }
  else {
    fclose((FILE *)FileNameDot._192_8_);
    Wlc_NtkDumpDot(p,(char *)&pName,vBold);
    Abc_ShowFile((char *)&pName);
  }
  return;
}

Assistant:

void Wlc_NtkShow( Wlc_Ntk_t * p, Vec_Int_t * vBold )
{
    extern void Abc_ShowFile( char * FileNameDot );
    FILE * pFile;
    char FileNameDot[200];
    char * pName = Extra_FileDesignName(p->pName);
    char * pSpec = p->pSpec ? Extra_FileDesignName(p->pSpec) : (char *)"unknown";
    sprintf( FileNameDot, "%s_%s.dot", pName, pSpec );
    ABC_FREE( pName );
    if ( strcmp(pSpec, "unknown") )
        ABC_FREE( pSpec );
    // check that the file can be opened
    if ( (pFile = fopen( FileNameDot, "w" )) == NULL )
    {
        fprintf( stdout, "Cannot open the intermediate file \"%s\".\n", FileNameDot );
        return;
    }
    fclose( pFile );
    // generate the file
    Wlc_NtkDumpDot( p, FileNameDot, vBold );
    // visualize the file 
    Abc_ShowFile( FileNameDot );
}